

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_general.h
# Opt level: O0

void mp::VisitArguments<mp::AlgebraicExpression<mp::LinTerms>>
               (ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_> *cc,
               function<void_(int)> *argv)

{
  AlgebraicExpression<mp::LinTerms> *in_RSI;
  ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_> *in_RDI;
  function<void_(int)> *in_stack_ffffffffffffffb0;
  function<void_(int)> *in_stack_ffffffffffffffc0;
  function<void_(int)> *in_stack_ffffffffffffffe8;
  AlgebraicExpression<mp::LinTerms> *item;
  
  item = in_RSI;
  ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>::GetVariable(in_RDI);
  std::function<void_(int)>::operator()(in_stack_ffffffffffffffb0,(int)((ulong)in_RSI >> 0x20));
  ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>::GetExpression(in_RDI);
  std::function<void_(int)>::function
            (in_stack_ffffffffffffffc0,(function<void_(int)> *)&stack0xffffffffffffffd0);
  VisitArguments<mp::AlgebraicExpression<mp::LinTerms>>(item,in_stack_ffffffffffffffe8);
  std::function<void_(int)>::~function((function<void_(int)> *)0x345e44);
  return;
}

Assistant:

inline void VisitArguments(const ComplementarityConstraint<Expr>& cc,
                           std::function<void (int) > argv) {
  argv(cc.GetVariable());
  VisitArguments(cc.GetExpression(), argv);
}